

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmCommonTargetGenerator::GetLinkedTargetDirectories_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmCommonTargetGenerator *this)

{
  bool bVar1;
  TargetType TVar2;
  cmComputeLinkInformation *this_00;
  pointer pIVar3;
  char *pcVar4;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar5;
  byte local_121;
  string local_f8 [39];
  allocator local_d1;
  undefined1 local_d0 [8];
  string di;
  cmLocalGenerator *lg;
  cmGeneratorTarget *local_88;
  cmGeneratorTarget *linkee;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_78;
  const_iterator i;
  ItemVector *items;
  cmComputeLinkInformation *cli;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  emitted;
  cmCommonTargetGenerator *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dirs;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
         *)&cli);
  this_00 = cmGeneratorTarget::GetLinkInformation(this->GeneratorTarget,&this->ConfigName);
  if (this_00 != (cmComputeLinkInformation *)0x0) {
    i._M_current = (Item *)cmComputeLinkInformation::GetItems(this_00);
    local_78._M_current =
         (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                          *)i._M_current);
    while( true ) {
      linkee = (cmGeneratorTarget *)
               std::
               vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
               ::end((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                      *)i._M_current);
      bVar1 = __gnu_cxx::operator!=
                        (&local_78,
                         (__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                          *)&linkee);
      if (!bVar1) break;
      pIVar3 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_78);
      local_88 = pIVar3->Target;
      local_121 = 0;
      if (local_88 != (cmGeneratorTarget *)0x0) {
        bVar1 = cmGeneratorTarget::IsImported(local_88);
        local_121 = 0;
        if (!bVar1) {
          TVar2 = cmGeneratorTarget::GetType(local_88);
          local_121 = 0;
          if (TVar2 != INTERFACE_LIBRARY) {
            pVar5 = std::
                    set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                    ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                              *)&cli,&local_88);
            local_121 = pVar5.second;
          }
        }
      }
      if ((local_121 & 1) != 0) {
        di.field_2._8_8_ = cmGeneratorTarget::GetLocalGenerator(local_88);
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)di.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_d0,pcVar4,&local_d1);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
        std::__cxx11::string::operator+=((string *)local_d0,"/");
        (**(code **)(*(long *)di.field_2._8_8_ + 0x60))(local_f8,di.field_2._8_8_,local_88);
        std::__cxx11::string::operator+=((string *)local_d0,local_f8);
        std::__cxx11::string::~string(local_f8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_d0);
        std::__cxx11::string::~string((string *)local_d0);
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&local_78);
    }
  }
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
  std::
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  ::~set((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *)&cli);
  if ((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmCommonTargetGenerator::GetLinkedTargetDirectories()
  const
{
  std::vector<std::string> dirs;
  std::set<cmGeneratorTarget const*> emitted;
  if (cmComputeLinkInformation* cli =
        this->GeneratorTarget->GetLinkInformation(this->ConfigName)) {
    cmComputeLinkInformation::ItemVector const& items = cli->GetItems();
    for (cmComputeLinkInformation::ItemVector::const_iterator i =
           items.begin();
         i != items.end(); ++i) {
      cmGeneratorTarget const* linkee = i->Target;
      if (linkee && !linkee->IsImported()
          // We can ignore the INTERFACE_LIBRARY items because
          // Target->GetLinkInformation already processed their
          // link interface and they don't have any output themselves.
          && linkee->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
          emitted.insert(linkee).second) {
        cmLocalGenerator* lg = linkee->GetLocalGenerator();
        std::string di = lg->GetCurrentBinaryDirectory();
        di += "/";
        di += lg->GetTargetDirectory(linkee);
        dirs.push_back(di);
      }
    }
  }
  return dirs;
}